

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O0

void bloaty::ReadDWARFInlines(File *file,RangeSink *sink,bool include_line)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  CompilationUnitSizes *this;
  byte in_DL;
  long in_RDI;
  optional<unsigned_long> stmt_list;
  Abbrev *abbrev;
  LineInfoReader line_info_reader;
  DIEReader die_reader;
  CU cu;
  CUIter iter;
  InfoReader reader;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  CU *in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  int line;
  CU *in_stack_fffffffffffffd70;
  Abbrev *in_stack_fffffffffffffd78;
  File *file_00;
  LineInfoReader *this_00;
  undefined8 in_stack_fffffffffffffd98;
  Section section;
  InfoReader *in_stack_fffffffffffffda0;
  Abbrev *local_248;
  CU *in_stack_fffffffffffffdc8;
  InfoReader *in_stack_fffffffffffffdd0;
  CU *in_stack_fffffffffffffdd8;
  RangeSink *in_stack_fffffffffffffde0;
  LineInfoReader *in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdf7;
  uint8_t in_stack_fffffffffffffe67;
  uint64_t in_stack_fffffffffffffe68;
  LineInfoReader *in_stack_fffffffffffffe70;
  undefined1 local_178 [359];
  byte local_11;
  long local_8;
  
  line = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  section = (Section)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_11 = in_DL & 1;
  local_8 = in_RDI;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x30));
  if ((sVar2 != 0) &&
     (sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)(local_8 + 0x40)),
     sVar2 != 0)) {
    this_00 = (LineInfoReader *)(local_178 + 0xe0);
    dwarf::InfoReader::InfoReader
              ((InfoReader *)in_stack_fffffffffffffd60,
               (File *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    dwarf::InfoReader::GetCUIter(in_stack_fffffffffffffda0,section,(uint64_t)this_00);
    file_00 = (File *)local_178;
    dwarf::CU::CU(in_stack_fffffffffffffd60);
    dwarf::CU::GetDIEReader(in_stack_fffffffffffffd70);
    dwarf::LineInfoReader::LineInfoReader(this_00,file_00);
    bVar1 = dwarf::CUIter::NextCU
                      ((CUIter *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                       in_stack_fffffffffffffdc8);
    if (bVar1) {
      while (in_stack_fffffffffffffd78 =
                  dwarf::DIEReader::ReadCode
                            ((DIEReader *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70),
            local_248 = in_stack_fffffffffffffd78, in_stack_fffffffffffffd78 != (Abbrev *)0x0) {
        in_stack_fffffffffffffd70 = (CU *)&stack0xfffffffffffffda8;
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x20a4c5);
        dwarf::DIEReader::
        ReadAttributes<bloaty::ReadDWARFInlines(bloaty::dwarf::File_const&,bloaty::RangeSink*,bool)::__0>
                  ((DIEReader *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                   (Abbrev *)in_stack_fffffffffffffdd0,
                   (anon_class_16_2_a4be2d54 *)in_stack_fffffffffffffdc8);
        bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x20a4ff);
        if (bVar1) {
          puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x20a50f);
          in_stack_fffffffffffffd60 = (CU *)*puVar3;
          this = dwarf::CU::unit_sizes((CU *)local_178);
          dwarf::CompilationUnitSizes::address_size(this);
          dwarf::LineInfoReader::SeekToOffset
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe67);
          ReadDWARFStmtList((bool)in_stack_fffffffffffffdf7,in_stack_fffffffffffffde8,
                            in_stack_fffffffffffffde0);
        }
      }
      dwarf::LineInfoReader::~LineInfoReader((LineInfoReader *)in_stack_fffffffffffffd60);
      dwarf::CU::~CU(in_stack_fffffffffffffd60);
      dwarf::InfoReader::~InfoReader((InfoReader *)in_stack_fffffffffffffd60);
      return;
    }
    Throw((char *)in_stack_fffffffffffffd70,line);
  }
  Throw((char *)in_stack_fffffffffffffd70,line);
}

Assistant:

void ReadDWARFInlines(const dwarf::File& file, RangeSink* sink,
                      bool include_line) {
  if (!file.debug_info.size() || !file.debug_line.size()) {
    THROW("no debug info");
  }

  dwarf::InfoReader reader(file);
  dwarf::CUIter iter = reader.GetCUIter(dwarf::InfoReader::Section::kDebugInfo);
  dwarf::CU cu;
  dwarf::DIEReader die_reader = cu.GetDIEReader();
  dwarf::LineInfoReader line_info_reader(file);

  if (!iter.NextCU(reader, &cu)) {
    THROW("debug info is present, but empty");
  }

  while (auto abbrev = die_reader.ReadCode(cu)) {
    absl::optional<uint64_t> stmt_list;
    die_reader.ReadAttributes(
        cu, abbrev, [&stmt_list, &cu](uint16_t tag, dwarf::AttrValue val) {
          if (tag == DW_AT_stmt_list) {
            stmt_list = val.ToUint(cu);
          }
        });

    if (stmt_list) {
      line_info_reader.SeekToOffset(*stmt_list, cu.unit_sizes().address_size());
      ReadDWARFStmtList(include_line, &line_info_reader, sink);
    }
  }
}